

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

void __thiscall
glslang::TIntermediate::mergeErrorCheck
          (TIntermediate *this,TInfoSink *infoSink,TIntermSymbol *symbol,TIntermSymbol *unitSymbol)

{
  byte bVar1;
  EShLanguage language;
  TString name;
  TString name_00;
  TString name_01;
  TString name_02;
  TString name_03;
  TString name_04;
  TString name_05;
  TString name_06;
  TString name_07;
  TString name_08;
  TString structName;
  TString structName_00;
  TString structName_01;
  TString structName_02;
  TString structName_03;
  TString structName_04;
  TString structName_05;
  TString structName_06;
  TString structName_07;
  TString structName_08;
  bool bVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined8 extraout_RAX;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined8 extraout_RAX_00;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  TTypeList *pTVar9;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  ulong uVar10;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  char *pcVar11;
  undefined4 extraout_var_50;
  TString *pTVar12;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  undefined4 extraout_var_53;
  TPoolAllocator *pTVar13;
  undefined4 extraout_var_54;
  undefined4 extraout_var_55;
  undefined4 extraout_var_56;
  undefined4 extraout_var_57;
  undefined8 extraout_RAX_01;
  undefined4 extraout_var_58;
  undefined4 extraout_var_59;
  undefined4 extraout_var_60;
  undefined4 extraout_var_61;
  undefined4 extraout_var_62;
  undefined4 extraout_var_63;
  undefined4 extraout_var_64;
  undefined4 extraout_var_65;
  undefined4 extraout_var_66;
  undefined4 extraout_var_67;
  undefined4 extraout_var_68;
  undefined4 extraout_var_69;
  undefined4 extraout_var_70;
  undefined4 extraout_var_71;
  undefined4 extraout_var_72;
  undefined4 extraout_var_73;
  undefined4 extraout_var_74;
  undefined4 extraout_var_75;
  undefined8 extraout_RAX_02;
  undefined4 extraout_var_76;
  undefined4 extraout_var_77;
  undefined4 extraout_var_78;
  undefined4 extraout_var_79;
  undefined8 extraout_RAX_03;
  undefined4 extraout_var_80;
  undefined4 extraout_var_81;
  undefined4 extraout_var_82;
  undefined4 extraout_var_83;
  undefined4 extraout_var_84;
  undefined4 extraout_var_85;
  undefined4 extraout_var_86;
  undefined4 extraout_var_87;
  undefined4 extraout_var_88;
  undefined4 extraout_var_89;
  undefined4 extraout_var_90;
  undefined4 extraout_var_91;
  undefined4 extraout_var_92;
  undefined4 extraout_var_93;
  ulong uVar14;
  undefined4 extraout_var_94;
  undefined4 extraout_var_95;
  undefined4 extraout_var_96;
  undefined4 extraout_var_97;
  undefined4 extraout_var_98;
  undefined4 extraout_var_99;
  undefined4 extraout_var_x00100;
  undefined4 extraout_var_x00101;
  undefined4 extraout_var_x00102;
  undefined4 extraout_var_x00103;
  undefined4 extraout_var_x00104;
  undefined4 extraout_var_x00105;
  undefined4 extraout_var_x00106;
  undefined4 extraout_var_x00107;
  undefined4 extraout_var_x00108;
  undefined4 extraout_var_x00109;
  undefined4 extraout_var_x00110;
  undefined4 extraout_var_x00111;
  undefined4 extraout_var_x00112;
  undefined4 extraout_var_x00113;
  undefined4 extraout_var_x00114;
  undefined4 extraout_var_x00115;
  undefined8 extraout_RAX_04;
  undefined4 extraout_var_x00116;
  undefined4 extraout_var_x00117;
  undefined4 extraout_var_x00118;
  undefined4 extraout_var_x00119;
  undefined4 extraout_var_x00120;
  undefined4 extraout_var_x00121;
  undefined4 extraout_var_x00122;
  undefined4 extraout_var_x00123;
  undefined4 extraout_var_x00124;
  undefined4 extraout_var_x00125;
  undefined4 extraout_var_x00126;
  undefined4 extraout_var_x00127;
  undefined4 extraout_var_x00128;
  undefined4 extraout_var_x00129;
  undefined4 extraout_var_x00130;
  undefined4 extraout_var_x00131;
  undefined4 extraout_var_x00132;
  undefined4 extraout_var_x00133;
  undefined4 extraout_var_x00134;
  undefined4 extraout_var_x00135;
  undefined4 extraout_var_x00136;
  undefined4 extraout_var_x00137;
  undefined4 extraout_var_x00138;
  undefined4 extraout_var_x00139;
  undefined4 extraout_var_x00140;
  undefined4 extraout_var_x00141;
  undefined4 extraout_var_x00142;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar15;
  TType *pTVar16;
  undefined4 extraout_var_x00144;
  undefined4 extraout_var_x00145;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar17;
  undefined4 extraout_var_x00146;
  undefined4 extraout_var_x00147;
  undefined4 extraout_var_x00148;
  undefined4 extraout_var_x00149;
  undefined4 extraout_var_x00150;
  undefined4 extraout_var_x00151;
  undefined4 extraout_var_x00152;
  undefined4 extraout_var_x00153;
  undefined4 extraout_var_x00154;
  undefined4 extraout_var_x00155;
  undefined4 extraout_var_x00156;
  undefined4 extraout_var_x00157;
  undefined4 extraout_var_x00158;
  undefined4 extraout_var_x00159;
  undefined8 uVar18;
  long lVar19;
  ulong uVar20;
  uint ri;
  int iVar21;
  uint uVar22;
  EShLanguage EVar23;
  undefined1 getPrecision;
  undefined1 getQualifiers;
  TIntermSymbol *pTVar24;
  ulong uVar25;
  byte bVar26;
  uint li;
  uint i;
  uint uVar27;
  undefined4 uVar28;
  EShLanguage EVar29;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *this_00;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *this_01;
  char cVar30;
  undefined4 in_stack_fffffffffffffb98;
  TIntermSymbol *pTVar31;
  undefined4 local_444;
  uint local_440;
  undefined4 uStack_43c;
  pool_allocator<char> local_438;
  int lpidx;
  undefined4 uStack_42c;
  ulong local_428;
  int rpidx;
  uint local_41c;
  TString errmsg;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_3c8;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_3a0 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_378 [40];
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_350;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_328 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_300 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_2d8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_2b0 [40];
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_260;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_238 [40];
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_210;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_1e8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_1c0 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_198 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_170 [40];
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_120;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_f8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_d0 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_a8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_80 [40];
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  undefined4 extraout_var_47;
  undefined4 extraout_var_x00143;
  
  language = symbol->stage;
  EVar29 = unitSymbol->stage;
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  bVar2 = isIoResizeArray((TType *)CONCAT44(extraout_var,iVar6),language);
  EVar23 = EVar29;
  pTVar24 = unitSymbol;
  if (bVar2) {
LAB_002fee81:
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    bVar2 = isIoResizeArray((TType *)CONCAT44(extraout_var_01,iVar6),language);
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])(symbol);
    iVar21 = 0;
    uVar27 = 0;
    if (CONCAT44(extraout_var_02,iVar6) != 0) {
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])(symbol);
      lVar19 = *(long *)(CONCAT44(extraout_var_03,iVar6) + 8);
      uVar27 = 0;
      if (lVar19 != 0) {
        uVar27 = (uint)((ulong)(*(long *)(lVar19 + 0x10) - *(long *)(lVar19 + 8)) >> 4);
      }
    }
    i = (uint)bVar2;
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                      (unitSymbol);
    bVar3 = isIoResizeArray((TType *)CONCAT44(extraout_var_04,iVar6),EVar23);
    uVar22 = (uint)bVar3;
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])
                      (unitSymbol);
    if (CONCAT44(extraout_var_05,iVar6) != 0) {
      iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])
                        (unitSymbol);
      lVar19 = *(long *)(CONCAT44(extraout_var_06,iVar6) + 8);
      if (lVar19 != 0) {
        iVar21 = (int)((ulong)(*(long *)(lVar19 + 0x10) - *(long *)(lVar19 + 8)) >> 4);
      }
    }
    if (uVar27 - bVar2 == iVar21 - (uint)bVar3) {
      do {
        cVar30 = uVar27 == i;
        if ((bool)cVar30) break;
        iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])(symbol);
        uVar7 = TSmallArrayVector::getDimSize
                          ((TSmallArrayVector *)CONCAT44(extraout_var_07,iVar6),i);
        iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])();
        uVar8 = TSmallArrayVector::getDimSize
                          ((TSmallArrayVector *)CONCAT44(extraout_var_08,iVar6),uVar22);
        i = i + 1;
        uVar22 = uVar22 + 1;
      } while (uVar7 == uVar8);
    }
    else {
LAB_002ff070:
      cVar30 = '\0';
    }
  }
  else {
    iVar6 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                      (unitSymbol);
    bVar2 = isIoResizeArray((TType *)CONCAT44(extraout_var_00,iVar6),EVar29);
    if (bVar2) goto LAB_002fee81;
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    iVar21 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                       (unitSymbol);
    bVar2 = TType::sameArrayness
                      ((TType *)CONCAT44(extraout_var_09,iVar6),
                       (TType *)CONCAT44(extraout_var_10,iVar21));
    cVar30 = '\x01';
    if (!bVar2) {
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar6) + 0xe8))
                        ((long *)CONCAT44(extraout_var_11,iVar6));
      if (cVar4 != '\0') {
        iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
        cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar6) + 0xe8))
                          ((long *)CONCAT44(extraout_var_12,iVar6));
        if (cVar4 != '\0') {
          iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
          cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar6) + 0x100))
                            ((long *)CONCAT44(extraout_var_13,iVar6));
          if (cVar4 == '\0') {
            iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
            cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar6) + 0x100))
                              ((long *)CONCAT44(extraout_var_14,iVar6));
            if (cVar4 == '\0') {
              iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                (symbol);
              cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar6) + 0xf8))
                                ((long *)CONCAT44(extraout_var_15,iVar6));
              if (cVar4 == '\0') {
                iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])()
                ;
                cVar30 = (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar6) + 0xf8))
                                   ((long *)CONCAT44(extraout_var_16,iVar6));
              }
            }
          }
          goto LAB_002ff073;
        }
      }
      goto LAB_002ff070;
    }
  }
LAB_002ff073:
  lpidx = -1;
  rpidx = -1;
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  iVar21 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  bVar2 = TType::sameElementType
                    ((TType *)CONCAT44(extraout_var_17,iVar6),
                     (TType *)CONCAT44(extraout_var_18,iVar21),&lpidx,&rpidx);
  EVar29 = EVar23;
  if (bVar2) {
    if (cVar30 == '\0') {
      pcVar11 = "Array sizes must be compatible:";
LAB_002ff3b3:
      error(this,infoSink,pcVar11,EVar23);
      local_444 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
      local_41c = 0;
      pTVar31 = pTVar24;
    }
    else {
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      pTVar31 = pTVar24;
      iVar21 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
      bVar2 = TType::sameTypeParameters
                        ((TType *)CONCAT44(extraout_var_19,iVar6),
                         (TType *)CONCAT44(extraout_var_20,iVar21));
      local_41c = 0;
      local_444 = 0;
      if (!bVar2) {
        error(this,infoSink,"Type parameters must match:",EVar23);
        local_444 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        local_41c = 0;
      }
    }
  }
  else if ((lpidx | rpidx) < 0) {
    if (rpidx == -1 && -1 < lpidx) {
      pcVar11 = StageName(language);
      local_438.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&errmsg,
                 pcVar11,&local_438);
      pbVar15 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          (&errmsg," block member has no corresponding member in ");
      pcVar11 = StageName(EVar23);
      pbVar15 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          (pbVar15,pcVar11);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(pbVar15," block:");
      error(this,infoSink,errmsg._M_dataplus._M_p,EVar23);
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar11 = StageName(language);
      TInfoSinkBase::append(&infoSink->info,pcVar11);
      TInfoSinkBase::append(&infoSink->info," stage: Block: ");
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      pTVar12 = (TString *)
                (**(code **)(*(long *)CONCAT44(extraout_var_28,iVar6) + 0x28))
                          ((long *)CONCAT44(extraout_var_28,iVar6));
      TInfoSinkBase::append(&infoSink->info,pTVar12);
      TInfoSinkBase::append(&infoSink->info,", Member: ");
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_29,iVar6));
      iVar6 = (*((pTVar9->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[lpidx].type)->_vptr_TType[6])();
      TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_30,iVar6));
      TInfoSinkBase::append(&infoSink->info,"\n");
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar11 = StageName(EVar23);
      TInfoSinkBase::append(&infoSink->info,pcVar11);
      TInfoSinkBase::append(&infoSink->info," stage: Block: ");
      pTVar31 = pTVar24;
      iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
      lVar19 = *(long *)CONCAT44(extraout_var_31,iVar6);
      pTVar12 = (TString *)(**(code **)(lVar19 + 0x28))((long *)CONCAT44(extraout_var_31,iVar6));
      TInfoSinkBase::append(&infoSink->info,pTVar12);
    }
    else {
      if (lpidx != -1 || rpidx < 0) {
        pcVar11 = "Types must match:";
        goto LAB_002ff3b3;
      }
      pcVar11 = StageName(EVar23);
      local_438.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&errmsg,
                 pcVar11,&local_438);
      pbVar15 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          (&errmsg," block member has no corresponding member in ");
      pcVar11 = StageName(language);
      pbVar15 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          (pbVar15,pcVar11);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(pbVar15," block:");
      error(this,infoSink,errmsg._M_dataplus._M_p,EVar23);
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar11 = StageName(EVar23);
      TInfoSinkBase::append(&infoSink->info,pcVar11);
      TInfoSinkBase::append(&infoSink->info," stage: Block: ");
      pTVar31 = pTVar24;
      iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
      pTVar12 = (TString *)
                (**(code **)(*(long *)CONCAT44(extraout_var_32,iVar6) + 0x28))
                          ((long *)CONCAT44(extraout_var_32,iVar6));
      TInfoSinkBase::append(&infoSink->info,pTVar12);
      TInfoSinkBase::append(&infoSink->info,", Member: ");
      iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
      pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_33,iVar6));
      iVar6 = (*((pTVar9->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[rpidx].type)->_vptr_TType[6])();
      TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_34,iVar6));
      TInfoSinkBase::append(&infoSink->info,"\n");
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar11 = StageName(language);
      TInfoSinkBase::append(&infoSink->info,pcVar11);
      TInfoSinkBase::append(&infoSink->info," stage: Block: ");
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      lVar19 = *(long *)CONCAT44(extraout_var_35,iVar6);
      pTVar12 = (TString *)(**(code **)(lVar19 + 0x28))((long *)CONCAT44(extraout_var_35,iVar6));
      TInfoSinkBase::append(&infoSink->info,pTVar12);
    }
    TInfoSinkBase::append(&infoSink->info,", Member: n/a \n");
    local_41c = (uint)CONCAT71((int7)((ulong)lVar19 >> 8),1);
    local_444 = 0;
  }
  else {
    error(this,infoSink,"Member names and types must match:",EVar23);
    TInfoSinkBase::append(&infoSink->info,"    Block: ");
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    pTVar12 = (TString *)
              (**(code **)(*(long *)CONCAT44(extraout_var_21,iVar6) + 0x28))
                        ((long *)CONCAT44(extraout_var_21,iVar6));
    TInfoSinkBase::append(&infoSink->info,pTVar12);
    TInfoSinkBase::append(&infoSink->info,"\n");
    TInfoSinkBase::append(&infoSink->info,"        ");
    pcVar11 = StageName(language);
    TInfoSinkBase::append(&infoSink->info,pcVar11);
    TInfoSinkBase::append(&infoSink->info," stage: \"");
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_22,iVar6));
    pTVar16 = (pTVar9->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
              .super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start[lpidx].type;
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_23,iVar6));
    iVar6 = (*((pTVar9->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
               ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start[lpidx].type)->_vptr_TType[6])();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(&local_58,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 CONCAT44(extraout_var_24,iVar6));
    local_438.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>(local_80,"",&local_438);
    local_444 = 0;
    name._M_dataplus._M_p = (pointer)local_80;
    name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_58;
    name._M_string_length._0_4_ = in_stack_fffffffffffffb98;
    name._M_string_length._4_4_ = EVar23;
    name.field_2._M_allocated_capacity._0_4_ = (int)this;
    name.field_2._M_allocated_capacity._4_4_ = (int)((ulong)this >> 0x20);
    name.field_2._8_8_ = pTVar24;
    structName._M_dataplus._M_p._0_4_ = language;
    structName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)infoSink;
    structName._M_dataplus._M_p._4_4_ = 0;
    structName._M_string_length._0_4_ = local_440;
    structName._M_string_length._4_4_ = uStack_43c;
    structName.field_2._M_allocated_capacity = (size_type)local_438.allocator;
    structName.field_2._8_4_ = lpidx;
    structName.field_2._12_4_ = uStack_42c;
    TType::getCompleteString(&errmsg,pTVar16,true,false,false,true,name,structName);
    TInfoSinkBase::append(&infoSink->info,&errmsg);
    TInfoSinkBase::append(&infoSink->info,"\"\n");
    TInfoSinkBase::append(&infoSink->info,"        ");
    pcVar11 = StageName(EVar23);
    TInfoSinkBase::append(&infoSink->info,pcVar11);
    TInfoSinkBase::append(&infoSink->info," stage: \"");
    pTVar31 = pTVar24;
    iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
    pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_25,iVar6));
    pTVar16 = (pTVar9->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
              .super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start[rpidx].type;
    iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
    pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_26,iVar6));
    iVar6 = (*((pTVar9->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
               ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start[rpidx].type)->_vptr_TType[6])();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(&local_350,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 CONCAT44(extraout_var_27,iVar6));
    local_438.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>(local_a8,"",&local_438);
    uVar18 = 0;
    name_00._M_dataplus._M_p = (pointer)local_a8;
    name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_350;
    name_00._M_string_length._0_4_ = in_stack_fffffffffffffb98;
    name_00._M_string_length._4_4_ = EVar23;
    name_00.field_2._M_allocated_capacity._0_4_ = (int)this;
    name_00.field_2._M_allocated_capacity._4_4_ = (int)((ulong)this >> 0x20);
    name_00.field_2._8_8_ = pTVar31;
    structName_00._M_dataplus._M_p._0_4_ = language;
    structName_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)infoSink;
    structName_00._M_dataplus._M_p._4_4_ = 0;
    structName_00._M_string_length._0_4_ = local_440;
    structName_00._M_string_length._4_4_ = uStack_43c;
    structName_00.field_2._M_allocated_capacity = (size_type)local_438.allocator;
    structName_00.field_2._8_4_ = lpidx;
    structName_00.field_2._12_4_ = uStack_42c;
    TType::getCompleteString(&errmsg,pTVar16,true,false,false,true,name_00,structName_00);
    EVar29 = EVar23;
    TInfoSinkBase::append(&infoSink->info,&errmsg);
    TInfoSinkBase::append(&infoSink->info,"\"\n");
    local_41c = (uint)CONCAT71((int7)((ulong)uVar18 >> 8),1);
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_36,iVar6) + 0x38))
                    ((long *)CONCAT44(extraout_var_36,iVar6));
  if (iVar6 == 0x10) {
    iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
    iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_37,iVar6) + 0x38))
                      ((long *)CONCAT44(extraout_var_37,iVar6));
    if (iVar6 == 0x10) {
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_38,iVar6));
      if (pTVar9 != (TTypeList *)0x0) {
        iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
        pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_39,iVar6));
        if (pTVar9 != (TTypeList *)0x0) {
          iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
          iVar21 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                             (pTVar24);
          uVar27 = 0;
          bVar2 = TType::sameStructType
                            ((TType *)CONCAT44(extraout_var_40,iVar6),
                             (TType *)CONCAT44(extraout_var_41,iVar21),(int *)0x0,(int *)0x0);
          if (bVar2) {
            uVar22 = 0;
            EVar23 = EVar29;
LAB_002ff7bd:
            do {
              uVar14 = (ulong)uVar27;
              while( true ) {
                iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (symbol);
                pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_42,iVar6));
                EVar29 = EVar23;
                if ((ulong)((long)(pTVar9->
                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ).
                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pTVar9->
                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ).
                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14)
                goto LAB_002ffcb7;
                uVar25 = (ulong)uVar22;
                iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])()
                ;
                pTVar24 = pTVar31;
                pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_43,iVar6));
                EVar29 = EVar23;
                pTVar31 = pTVar24;
                if ((ulong)((long)(pTVar9->
                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ).
                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pTVar9->
                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ).
                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar25)
                goto LAB_002ffcb7;
                iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (symbol);
                pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_44,iVar6));
                iVar6 = (*((pTVar9->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ).
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar14].type)->_vptr_TType[3])
                                  ();
                if ((char)iVar6 != '\0') {
                  uVar27 = uVar27 + 1;
                  pTVar31 = pTVar24;
                  goto LAB_002ff7bd;
                }
                iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])()
                ;
                pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_45,iVar6));
                iVar6 = (*((pTVar9->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ).
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar25].type)->_vptr_TType[3])
                                  ();
                if ((char)iVar6 == '\0') break;
                uVar22 = uVar22 + 1;
                pTVar31 = pTVar24;
              }
              iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                (symbol);
              pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_46,iVar6));
              iVar6 = (*((pTVar9->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ).
                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar14].type)->_vptr_TType[10])()
              ;
              uVar10 = CONCAT44(extraout_var_47,iVar6);
              iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
              pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_48,iVar6));
              iVar6 = (*((pTVar9->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ).
                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar25].type)->_vptr_TType[10])()
              ;
              uVar20 = *(ulong *)(CONCAT44(extraout_var_49,iVar6) + 8) ^ *(ulong *)(uVar10 + 8);
              cVar30 = 0x1fffffffffffffff < uVar20;
              if (0x1fffffffffffffff < uVar20) {
                local_428 = CONCAT71(local_428._1_7_,0x1fffffffffffffff < uVar20);
                error(this,infoSink,"Interface block member layout matrix qualifier must match:",
                      EVar23);
                cVar30 = (char)local_428;
              }
              if (*(int *)(uVar10 + 0x14) != *(int *)(CONCAT44(extraout_var_49,iVar6) + 0x14)) {
                error(this,infoSink,"Interface block member layout offset qualifier must match:",
                      EVar23);
                cVar30 = '\x01';
              }
              if (*(int *)(uVar10 + 0x18) != *(int *)(CONCAT44(extraout_var_49,iVar6) + 0x18)) {
                error(this,infoSink,"Interface block member layout align qualifier must match:",
                      EVar23);
                cVar30 = '\x01';
              }
              uVar20 = *(ulong *)(CONCAT44(extraout_var_49,iVar6) + 0x1c) ^
                       *(ulong *)(uVar10 + 0x1c);
              if ((uVar20 & 0xfff) == 0) {
                if ((uVar20 & 0x7000) != 0) goto LAB_002ff9c3;
                pTVar31 = pTVar24;
                uStack_43c = extraout_var_49;
                if (cVar30 != '\0') goto LAB_002ff9db;
              }
              else {
                local_428 = uVar10;
                error(this,infoSink,"Interface block member layout location qualifier must match:",
                      EVar23);
                pTVar31 = pTVar24;
                if (((*(uint *)(CONCAT44(extraout_var_49,iVar6) + 0x1c) ^
                     *(uint *)(local_428 + 0x1c)) & 0x7000) != 0) {
LAB_002ff9c3:
                  error(this,infoSink,
                        "Interface block member layout component qualifier must match:",EVar23);
                  pTVar31 = pTVar24;
                }
LAB_002ff9db:
                TInfoSinkBase::append(&infoSink->info,"    ");
                pcVar11 = StageName(language);
                TInfoSinkBase::append(&infoSink->info,pcVar11);
                TInfoSinkBase::append(&infoSink->info," stage: Block: ");
                iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (symbol);
                pTVar12 = (TString *)
                          (**(code **)(*(long *)CONCAT44(extraout_var_50,iVar6) + 0x28))
                                    ((long *)CONCAT44(extraout_var_50,iVar6));
                TInfoSinkBase::append(&infoSink->info,pTVar12);
                TInfoSinkBase::append(&infoSink->info,", Member: ");
                iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (symbol);
                pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_51,iVar6));
                iVar6 = (*((pTVar9->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ).
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar14].type)->_vptr_TType[6])
                                  ();
                TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_52,iVar6));
                TInfoSinkBase::append(&infoSink->info," \"");
                iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (symbol);
                pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_53,iVar6));
                pTVar16 = (pTVar9->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ).
                          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar14].type;
                local_440 = (uint)pTVar16;
                uStack_43c = (undefined4)((ulong)pTVar16 >> 0x20);
                local_438.allocator = GetThreadPoolAllocator();
                std::__cxx11::
                basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                basic_string<glslang::std::allocator<char>>(local_378,"",&local_438);
                pTVar13 = GetThreadPoolAllocator();
                lpidx = (int)pTVar13;
                uStack_42c = (undefined4)((ulong)pTVar13 >> 0x20);
                std::__cxx11::
                basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                basic_string<glslang::std::allocator<char>>
                          (local_d0,"",(pool_allocator<char> *)&lpidx);
                name_01._M_dataplus._M_p = (pointer)local_d0;
                name_01._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_378;
                name_01._M_string_length._0_4_ = in_stack_fffffffffffffb98;
                name_01._M_string_length._4_4_ = EVar23;
                name_01.field_2._M_allocated_capacity._0_4_ = (int)this;
                name_01.field_2._M_allocated_capacity._4_4_ = (int)((ulong)this >> 0x20);
                name_01.field_2._8_8_ = pTVar31;
                structName_01._M_dataplus._M_p._0_4_ = language;
                structName_01._M_dataplus.super_allocator_type.allocator =
                     (TPoolAllocator *)infoSink;
                structName_01._M_dataplus._M_p._4_4_ = local_444;
                structName_01._M_string_length._0_4_ = local_440;
                structName_01._M_string_length._4_4_ = uStack_43c;
                structName_01.field_2._M_allocated_capacity = (size_type)local_438.allocator;
                structName_01.field_2._8_4_ = lpidx;
                structName_01.field_2._12_4_ = uStack_42c;
                TType::getCompleteString
                          (&errmsg,pTVar16,true,true,false,false,name_01,structName_01);
                TInfoSinkBase::append(&infoSink->info,&errmsg);
                TInfoSinkBase::append(&infoSink->info,"\"\n");
                TInfoSinkBase::append(&infoSink->info,"    ");
                pcVar11 = StageName(EVar23);
                TInfoSinkBase::append(&infoSink->info,pcVar11);
                TInfoSinkBase::append(&infoSink->info," stage: Block: ");
                pTVar24 = pTVar31;
                iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (pTVar31);
                pTVar12 = (TString *)
                          (**(code **)(*(long *)CONCAT44(extraout_var_54,iVar6) + 0x28))
                                    ((long *)CONCAT44(extraout_var_54,iVar6));
                TInfoSinkBase::append(&infoSink->info,pTVar12);
                TInfoSinkBase::append(&infoSink->info,", Member: ");
                iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (pTVar31);
                pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_55,iVar6));
                iVar6 = (*((pTVar9->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ).
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar25].type)->_vptr_TType[6])
                                  ();
                TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_56,iVar6));
                TInfoSinkBase::append(&infoSink->info," \"");
                iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                  (pTVar31);
                pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_57,iVar6));
                pTVar16 = (pTVar9->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ).
                          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar25].type;
                local_440 = (uint)pTVar16;
                uStack_43c = (undefined4)((ulong)pTVar16 >> 0x20);
                local_438.allocator = GetThreadPoolAllocator();
                std::__cxx11::
                basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                basic_string<glslang::std::allocator<char>>(local_3a0,"",&local_438);
                pTVar13 = GetThreadPoolAllocator();
                lpidx = (int)pTVar13;
                uStack_42c = (undefined4)((ulong)pTVar13 >> 0x20);
                std::__cxx11::
                basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                basic_string<glslang::std::allocator<char>>
                          (local_f8,"",(pool_allocator<char> *)&lpidx);
                name_02._M_dataplus._M_p = (pointer)local_f8;
                name_02._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_3a0;
                name_02._M_string_length._0_4_ = in_stack_fffffffffffffb98;
                name_02._M_string_length._4_4_ = EVar23;
                name_02.field_2._M_allocated_capacity._0_4_ = (int)this;
                name_02.field_2._M_allocated_capacity._4_4_ = (int)((ulong)this >> 0x20);
                name_02.field_2._8_8_ = pTVar24;
                structName_02._M_dataplus._M_p._0_4_ = language;
                structName_02._M_dataplus.super_allocator_type.allocator =
                     (TPoolAllocator *)infoSink;
                structName_02._M_dataplus._M_p._4_4_ = local_444;
                structName_02._M_string_length._0_4_ = local_440;
                structName_02._M_string_length._4_4_ = uStack_43c;
                structName_02.field_2._M_allocated_capacity = (size_type)local_438.allocator;
                structName_02.field_2._8_4_ = lpidx;
                structName_02.field_2._12_4_ = uStack_42c;
                TType::getCompleteString
                          (&errmsg,pTVar16,true,true,false,false,name_02,structName_02);
                TInfoSinkBase::append(&infoSink->info,&errmsg);
                TInfoSinkBase::append(&infoSink->info,"\"\n");
                local_41c = (uint)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
              }
              uVar27 = uVar27 + 1;
              uVar22 = uVar22 + 1;
              pTVar31 = pTVar24;
            } while( true );
          }
        }
      }
    }
  }
LAB_002ffcb7:
  if ((language == EVar23) ||
     (((iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol),
       (*(uint *)(CONCAT44(extraout_var_58,iVar6) + 8) & 0x7f) != 3 ||
       (iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar24),
       (*(uint *)(CONCAT44(extraout_var_59,iVar6) + 8) & 0x7f) != 4)) &&
      ((iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol),
       (*(uint *)(CONCAT44(extraout_var_60,iVar6) + 8) & 0x7f) != 4 ||
       (iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar24),
       (*(uint *)(CONCAT44(extraout_var_61,iVar6) + 8) & 0x7f) != 3)))))) {
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    uVar27 = *(uint *)(CONCAT44(extraout_var_62,iVar6) + 8);
    iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar24);
    if (((uVar27 ^ *(uint *)(CONCAT44(extraout_var_63,iVar6) + 8)) & 0x7f) == 0) {
      bVar2 = false;
      goto LAB_002ffd6d;
    }
    error(this,infoSink,"Storage qualifiers must match:",EVar23);
    local_440 = 1;
    bVar2 = false;
    uVar28 = 1;
  }
  else {
    bVar2 = true;
LAB_002ffd6d:
    local_440 = 0;
    uVar28 = local_444;
  }
  bVar26 = (byte)uVar28;
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((*(uint *)(CONCAT44(extraout_var_64,iVar6) + 8) & 0x7f) - 5 < 2) {
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
    bVar3 = IsAnonymous((TString *)CONCAT44(extraout_var_65,iVar6));
    iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
    bVar5 = IsAnonymous((TString *)CONCAT44(extraout_var_66,iVar6));
    if (bVar3 != bVar5) {
      error(this,infoSink,
            "Matched Uniform or Storage blocks must all be anonymous, or all be named:",EVar23);
      bVar26 = 1;
    }
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar27 = *(uint *)(CONCAT44(extraout_var_67,iVar6) + 8);
  pTVar24 = pTVar31;
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar31);
  EVar23 = EVar29;
  if (((uVar27 ^ *(uint *)(CONCAT44(extraout_var_68,iVar6) + 8)) & 0x7f) == 0) {
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
    bVar3 = IsAnonymous((TString *)CONCAT44(extraout_var_69,iVar6));
    iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar31);
    bVar5 = IsAnonymous((TString *)CONCAT44(extraout_var_70,iVar6));
    EVar23 = EVar29;
    if (bVar3 == bVar5) {
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
      bVar3 = IsAnonymous((TString *)CONCAT44(extraout_var_71,iVar6));
      if (!bVar3) {
        iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
        iVar21 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)CONCAT44(extraout_var_72,iVar6),
                                (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)CONCAT44(extraout_var_73,iVar21));
        if (bVar3) goto LAB_002ffe52;
      }
    }
    else {
LAB_002ffe52:
      warn(this,infoSink,"Matched shader interfaces are using different instance names.",EVar29);
      bVar26 = 1;
    }
  }
  if (bVar2) {
    local_428 = local_428 & 0xffffffff00000000;
    pTVar31 = pTVar24;
  }
  else {
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    uVar27 = *(uint *)(CONCAT44(extraout_var_74,iVar6) + 8);
    pTVar31 = pTVar24;
    iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar24);
    if (((uVar27 ^ *(uint *)(CONCAT44(extraout_var_75,iVar6) + 8)) & 0xe000000) == 0) {
      local_428 = local_428 & 0xffffffff00000000;
    }
    else {
      error(this,infoSink,"Precision qualifiers must match:",EVar29);
      local_428 = CONCAT44(local_428._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),1));
      bVar26 = 1;
    }
  }
  if (language == EVar29) {
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    uVar27 = *(uint *)(CONCAT44(extraout_var_76,iVar6) + 8);
    iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar24);
    if (((uVar27 ^ *(uint *)(CONCAT44(extraout_var_77,iVar6) + 8)) >> 0x1c & 1) != 0) {
      error(this,infoSink,"Presence of invariant qualifier must match:",language);
      local_440 = 1;
      bVar26 = 1;
    }
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    uVar18 = *(undefined8 *)(CONCAT44(extraout_var_78,iVar6) + 8);
    iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar24);
    if (((byte)(uint)((ulong)uVar18 >> 0x24) & 1) !=
        (*(byte *)(CONCAT44(extraout_var_79,iVar6) + 0xc) & 0x10) >> 4) {
      error(this,infoSink,"Presence of precise qualifier must match:",language);
      local_428 = CONCAT44(local_428._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX_03 >> 8),1));
      bVar26 = 1;
    }
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    uVar27 = *(uint *)(CONCAT44(extraout_var_80,iVar6) + 8);
    iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar24);
    if (((uVar27 ^ *(uint *)(CONCAT44(extraout_var_81,iVar6) + 8)) >> 0x1d & 1) == 0) {
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      uVar27 = *(uint *)(CONCAT44(extraout_var_82,iVar6) + 8);
      iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar24);
      if (((uVar27 ^ *(uint *)(CONCAT44(extraout_var_83,iVar6) + 8)) >> 0x1e & 1) == 0) {
        iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
        iVar6 = *(int *)(CONCAT44(extraout_var_84,iVar6) + 8);
        iVar21 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar24)
        ;
        if (iVar6 < 0 != ((*(byte *)(CONCAT44(extraout_var_85,iVar21) + 0xb) & 0x80) == 0)) {
          iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
          uVar18 = *(undefined8 *)(CONCAT44(extraout_var_86,iVar6) + 8);
          iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                            (pTVar24);
          if (((byte)(uint)((ulong)uVar18 >> 0x2d) & 1) ==
              (*(byte *)(CONCAT44(extraout_var_87,iVar6) + 0xd) & 0x20) >> 5) {
            iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                              (symbol);
            uVar18 = *(undefined8 *)(CONCAT44(extraout_var_88,iVar6) + 8);
            iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                              (pTVar24);
            if (((byte)(uint)((ulong)uVar18 >> 0x2c) & 1) ==
                (*(byte *)(CONCAT44(extraout_var_89,iVar6) + 0xd) & 0x10) >> 4) {
              iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                                (symbol);
              uVar18 = *(undefined8 *)(CONCAT44(extraout_var_90,iVar6) + 8);
              iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                                (pTVar24);
              if (((byte)(uint)((ulong)uVar18 >> 0x25) & 1) ==
                  (*(byte *)(CONCAT44(extraout_var_91,iVar6) + 0xc) & 0x20) >> 5) goto LAB_003000f0;
            }
          }
        }
      }
    }
    error(this,infoSink,"Interpolation and auxiliary storage qualifiers must match:",language);
    local_440 = 1;
    bVar26 = 1;
  }
LAB_003000f0:
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar14 = *(ulong *)(CONCAT44(extraout_var_92,iVar6) + 8);
  iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar24);
  uVar14 = (uVar14 ^ *(ulong *)(CONCAT44(extraout_var_93,iVar6) + 8)) & 0x2000000000000;
  uVar25 = uVar14 >> 0x31;
  if (uVar14 != 0) {
    error(this,infoSink,"Memory coherent qualifier must match:",EVar29);
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar14 = *(ulong *)(CONCAT44(extraout_var_94,iVar6) + 8);
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((uVar14 ^ *(ulong *)(CONCAT44(extraout_var_95,iVar6) + 8)) >> 0x34 & 1) != 0) {
    error(this,infoSink,"Memory devicecoherent qualifier must match:",EVar29);
    uVar25 = 1;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar14 = *(ulong *)(CONCAT44(extraout_var_96,iVar6) + 8);
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((uVar14 ^ *(ulong *)(CONCAT44(extraout_var_97,iVar6) + 8)) >> 0x35 & 1) != 0) {
    error(this,infoSink,"Memory queuefamilycoherent qualifier must match:",EVar29);
    uVar25 = 1;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar14 = *(ulong *)(CONCAT44(extraout_var_98,iVar6) + 8);
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((uVar14 ^ *(ulong *)(CONCAT44(extraout_var_99,iVar6) + 8)) >> 0x36 & 1) != 0) {
    error(this,infoSink,"Memory workgroupcoherent qualifier must match:",EVar29);
    uVar25 = 1;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar14 = *(ulong *)(CONCAT44(extraout_var_x00100,iVar6) + 8);
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((uVar14 ^ *(ulong *)(CONCAT44(extraout_var_x00101,iVar6) + 8)) >> 0x37 & 1) != 0) {
    error(this,infoSink,"Memory subgroupcoherent qualifier must match:",EVar29);
    uVar25 = 1;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar14 = *(ulong *)(CONCAT44(extraout_var_x00102,iVar6) + 8);
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((uVar14 ^ *(ulong *)(CONCAT44(extraout_var_x00103,iVar6) + 8)) >> 0x38 & 1) != 0) {
    error(this,infoSink,"Memory shadercallcoherent qualifier must match:",EVar29);
    uVar25 = 1;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar14 = *(ulong *)(CONCAT44(extraout_var_x00104,iVar6) + 8);
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((uVar14 ^ *(ulong *)(CONCAT44(extraout_var_x00105,iVar6) + 8)) >> 0x39 & 1) != 0) {
    error(this,infoSink,"Memory nonprivate qualifier must match:",EVar29);
    uVar25 = 1;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar14 = *(ulong *)(CONCAT44(extraout_var_x00106,iVar6) + 8);
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((uVar14 ^ *(ulong *)(CONCAT44(extraout_var_x00107,iVar6) + 8)) >> 0x32 & 1) != 0) {
    error(this,infoSink,"Memory volatil qualifier must match:",EVar29);
    uVar25 = 1;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar14 = *(ulong *)(CONCAT44(extraout_var_x00108,iVar6) + 8);
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((uVar14 ^ *(ulong *)(CONCAT44(extraout_var_x00109,iVar6) + 8)) >> 0x33 & 1) != 0) {
    error(this,infoSink,"Memory nontemporal qualifier must match:",EVar29);
    uVar25 = 1;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar14 = *(ulong *)(CONCAT44(extraout_var_x00110,iVar6) + 8);
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((uVar14 ^ *(ulong *)(CONCAT44(extraout_var_x00111,iVar6) + 8)) >> 0x2e & 1) != 0) {
    error(this,infoSink,"Memory restrict qualifier must match:",EVar29);
    uVar25 = 1;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar14 = *(ulong *)(CONCAT44(extraout_var_x00112,iVar6) + 8);
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((uVar14 ^ *(ulong *)(CONCAT44(extraout_var_x00113,iVar6) + 8)) >> 0x2f & 1) != 0) {
    error(this,infoSink,"Memory readonly qualifier must match:",EVar29);
    uVar25 = 1;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar14 = *(ulong *)(CONCAT44(extraout_var_x00114,iVar6) + 8);
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((uVar14 ^ *(ulong *)(CONCAT44(extraout_var_x00115,iVar6) + 8)) >> 0x30 & 1) == 0) {
    if (uVar25 != 0) {
      local_440 = 1;
    }
    bVar26 = bVar26 | (byte)uVar25;
  }
  else {
    error(this,infoSink,"Memory writeonly qualifier must match:",EVar29);
    local_440 = (uint)CONCAT71((int7)((ulong)extraout_RAX_04 >> 8),1);
    bVar26 = 1;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar14 = *(ulong *)(CONCAT44(extraout_var_x00116,iVar6) + 8);
  pTVar24 = pTVar31;
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar31);
  uVar14 = uVar14 ^ *(ulong *)(CONCAT44(extraout_var_x00117,iVar6) + 8);
  if (0x1fffffffffffffff < uVar14) {
    error(this,infoSink,"Layout matrix qualifier must match:",EVar23);
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  bVar1 = *(byte *)(CONCAT44(extraout_var_x00118,iVar6) + 0x10);
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar31);
  bVar2 = ((bVar1 ^ *(byte *)(CONCAT44(extraout_var_x00119,iVar6) + 0x10)) & 0xf) != 0;
  if (bVar2) {
    error(this,infoSink,"Layout packing qualifier must match:",EVar23);
  }
  bVar2 = bVar2 || 0x1fffffffffffffff < uVar14;
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if (((~*(uint *)(CONCAT44(extraout_var_x00120,iVar6) + 0x1c) & 0xfff) != 0) &&
     (iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar31),
     (~*(uint *)(CONCAT44(extraout_var_x00121,iVar6) + 0x1c) & 0xfff) != 0)) {
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    uVar27 = *(uint *)(CONCAT44(extraout_var_x00122,iVar6) + 0x1c);
    iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar31);
    if (((uVar27 ^ *(uint *)(CONCAT44(extraout_var_x00123,iVar6) + 0x1c)) & 0xfff) != 0) {
      error(this,infoSink,"Layout location qualifier must match:",EVar23);
      bVar2 = true;
    }
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar27 = *(uint *)(CONCAT44(extraout_var_x00124,iVar6) + 0x1c);
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar31);
  if (((uVar27 ^ *(uint *)(CONCAT44(extraout_var_x00125,iVar6) + 0x1c)) & 0x7000) != 0) {
    error(this,infoSink,"Layout component qualifier must match:",EVar23);
    bVar2 = true;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar18 = *(undefined8 *)(CONCAT44(extraout_var_x00126,iVar6) + 0x1c);
  iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar31);
  if ((char)((ulong)uVar18 >> 0x30) !=
      (char)((ulong)*(undefined8 *)(CONCAT44(extraout_var_x00127,iVar6) + 0x1c) >> 0x30)) {
    error(this,infoSink,"Layout index qualifier must match:",EVar23);
    bVar2 = true;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if (((~*(ulong *)(CONCAT44(extraout_var_x00128,iVar6) + 0x1c) & 0xffff00000000) != 0) &&
     (iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar31),
     (~*(ulong *)(CONCAT44(extraout_var_x00129,iVar6) + 0x1c) & 0xffff00000000) != 0)) {
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    uVar14 = *(ulong *)(CONCAT44(extraout_var_x00130,iVar6) + 0x1c);
    iVar6 = (*(pTVar31->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar31);
    if (((uVar14 ^ *(ulong *)(CONCAT44(extraout_var_x00131,iVar6) + 0x1c)) & 0xffff00000000) != 0) {
      error(this,infoSink,"Layout binding qualifier must match:",EVar23);
      bVar2 = true;
    }
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((~*(ulong *)(CONCAT44(extraout_var_x00132,iVar6) + 0x1c) & 0xffff00000000) == 0) {
LAB_003006a7:
    uVar27 = local_440 & 0xff;
    if (bVar2) {
      uVar27 = 1;
    }
    if (bVar26 == 0 && !bVar2) {
      if ((local_41c & 1) != 0) {
        return;
      }
      if ((symbol->constArray).unionArray == (TConstUnionVector *)0x0) {
        return;
      }
      if ((pTVar24->constArray).unionArray == (TConstUnionVector *)0x0) {
        return;
      }
      bVar2 = TConstUnionArray::operator!=(&symbol->constArray,&pTVar24->constArray);
      if (!bVar2) {
        return;
      }
      error(this,infoSink,"Initializers must match:",EVar23);
      TInfoSinkBase::append(&infoSink->info,"    ");
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
      TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_x00135,iVar6));
      pcVar11 = "\n";
      goto LAB_00300cf5;
    }
  }
  else {
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    iVar6 = *(int *)(CONCAT44(extraout_var_x00133,iVar6) + 0x14);
    iVar21 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    if (iVar6 == *(int *)(CONCAT44(extraout_var_x00134,iVar21) + 0x14)) goto LAB_003006a7;
    error(this,infoSink,"Layout offset qualifier must match:",EVar23);
    uVar27 = 1;
  }
  iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_x00136,iVar6) + 0x38))
                    ((long *)CONCAT44(extraout_var_x00136,iVar6));
  getQualifiers = (undefined1)uVar27;
  if (iVar6 == 0x10) {
    iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_x00137,iVar6) + 0x38))
                      ((long *)CONCAT44(extraout_var_x00137,iVar6));
    if (iVar6 != 0x10) goto LAB_00300989;
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_x00138,iVar6));
    if (pTVar9 == (TTypeList *)0x0) goto LAB_00300989;
    iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_x00139,iVar6));
    if (pTVar9 == (TTypeList *)0x0) goto LAB_00300989;
    TInfoSinkBase::append(&infoSink->info,"    ");
    pcVar11 = StageName(language);
    TInfoSinkBase::append(&infoSink->info,pcVar11);
    if ((char)local_444 == '\0') {
      TInfoSinkBase::append(&infoSink->info," stage: Block: ");
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      pTVar12 = (TString *)
                (**(code **)(*(long *)CONCAT44(extraout_var_x00154,iVar6) + 0x28))
                          ((long *)CONCAT44(extraout_var_x00154,iVar6));
      TInfoSinkBase::append(&infoSink->info,pTVar12);
      TInfoSinkBase::append(&infoSink->info," Instance: ");
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
      TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_x00155,iVar6));
      TInfoSinkBase::append(&infoSink->info,": \"");
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      uVar28 = (undefined4)((ulong)this >> 0x20);
      local_438.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>(local_170,"",&local_438);
      pTVar13 = GetThreadPoolAllocator();
      lpidx = (int)pTVar13;
      uStack_42c = (undefined4)((ulong)pTVar13 >> 0x20);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>(local_198,"",(pool_allocator<char> *)&lpidx);
      getPrecision = (char)local_428;
      name_08._M_dataplus._M_p = (pointer)local_198;
      name_08._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_170;
      name_08._M_string_length._0_4_ = in_stack_fffffffffffffb98;
      name_08._M_string_length._4_4_ = EVar23;
      name_08.field_2._M_allocated_capacity._0_4_ = uVar27;
      name_08.field_2._M_allocated_capacity._4_4_ = uVar28;
      name_08.field_2._8_8_ = pTVar24;
      structName_08._M_dataplus._M_p._0_4_ = language;
      structName_08._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)infoSink;
      structName_08._M_dataplus._M_p._4_4_ = local_444;
      structName_08._M_string_length._0_4_ = local_440;
      structName_08._M_string_length._4_4_ = uStack_43c;
      structName_08.field_2._M_allocated_capacity = (size_type)local_438.allocator;
      structName_08.field_2._8_4_ = lpidx;
      structName_08.field_2._12_4_ = uStack_42c;
      TType::getCompleteString
                (&errmsg,(TType *)CONCAT44(extraout_var_x00156,iVar6),true,(bool)getQualifiers,
                 (bool)(char)local_428,false,name_08,structName_08);
      TInfoSinkBase::append(&infoSink->info,&errmsg);
      TInfoSinkBase::append(&infoSink->info,"\"\n");
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar11 = StageName(EVar23);
      TInfoSinkBase::append(&infoSink->info,pcVar11);
      TInfoSinkBase::append(&infoSink->info," stage: Block: ");
      pTVar31 = pTVar24;
      iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
      pTVar12 = (TString *)
                (**(code **)(*(long *)CONCAT44(extraout_var_x00157,iVar6) + 0x28))
                          ((long *)CONCAT44(extraout_var_x00157,iVar6));
      TInfoSinkBase::append(&infoSink->info,pTVar12);
      TInfoSinkBase::append(&infoSink->info," Instance: ");
      iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar24);
      TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_x00158,iVar6));
      TInfoSinkBase::append(&infoSink->info,": \"");
      iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
      pTVar16 = (TType *)CONCAT44(extraout_var_x00159,iVar6);
      local_438.allocator = GetThreadPoolAllocator();
      this_00 = local_1c0;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>(this_00,"",&local_438);
      pTVar13 = GetThreadPoolAllocator();
      lpidx = (int)pTVar13;
      uStack_42c = (undefined4)((ulong)pTVar13 >> 0x20);
      this_01 = local_1e8;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>(this_01,"",(pool_allocator<char> *)&lpidx);
      getQualifiers = (undefined1)uVar27;
      goto LAB_00300cd0;
    }
    TInfoSinkBase::append(&infoSink->info," stage: \"");
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    iVar21 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(&local_3c8,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 CONCAT44(extraout_var_x00141,iVar21));
    iVar21 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    pbVar15 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_x00142,iVar21) + 0x28))
                        ((long *)CONCAT44(extraout_var_x00142,iVar21));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(&local_120,pbVar15);
    bVar2 = (bool)(char)local_428;
    name_03._M_dataplus._M_p = (pointer)&local_120;
    name_03._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_3c8;
    name_03._M_string_length._0_4_ = in_stack_fffffffffffffb98;
    name_03._M_string_length._4_4_ = EVar23;
    name_03.field_2._M_allocated_capacity._0_4_ = (int)this;
    name_03.field_2._M_allocated_capacity._4_4_ = (int)((ulong)this >> 0x20);
    name_03.field_2._8_8_ = pTVar24;
    structName_03._M_dataplus._M_p._0_4_ = language;
    structName_03._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)infoSink;
    structName_03._M_dataplus._M_p._4_4_ = local_444;
    structName_03._M_string_length._0_4_ = local_440;
    structName_03._M_string_length._4_4_ = uStack_43c;
    structName_03.field_2._M_allocated_capacity = (size_type)local_438.allocator;
    structName_03.field_2._8_4_ = lpidx;
    structName_03.field_2._12_4_ = uStack_42c;
    TType::getCompleteString
              (&errmsg,(TType *)CONCAT44(extraout_var_x00140,iVar6),true,(bool)getQualifiers,
               (bool)(char)local_428,true,name_03,structName_03);
    TInfoSinkBase::append(&infoSink->info,&errmsg);
    TInfoSinkBase::append(&infoSink->info,"\"\n");
    TInfoSinkBase::append(&infoSink->info,"    ");
    pcVar11 = StageName(EVar23);
    TInfoSinkBase::append(&infoSink->info,pcVar11);
    TInfoSinkBase::append(&infoSink->info," stage: \"");
    pTVar31 = pTVar24;
    iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
    pTVar16 = (TType *)CONCAT44(extraout_var_x00143,iVar6);
    iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar24);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(&local_3f0,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 CONCAT44(extraout_var_x00144,iVar6));
    iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
    pbVar17 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_x00145,iVar6) + 0x28))
                        ((long *)CONCAT44(extraout_var_x00145,iVar6));
    pbVar15 = &local_148;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(pbVar15,pbVar17);
    pbVar17 = &local_3f0;
LAB_00300b0a:
    name_05._M_dataplus._M_p = (pointer)pbVar15;
    name_05._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)pbVar17;
    name_05._M_string_length._0_4_ = in_stack_fffffffffffffb98;
    name_05._M_string_length._4_4_ = EVar23;
    name_05.field_2._M_allocated_capacity._0_4_ = (int)this;
    name_05.field_2._M_allocated_capacity._4_4_ = (int)((ulong)this >> 0x20);
    name_05.field_2._8_8_ = pTVar31;
    structName_05._M_dataplus._M_p._0_4_ = language;
    structName_05._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)infoSink;
    structName_05._M_dataplus._M_p._4_4_ = local_444;
    structName_05._M_string_length._0_4_ = local_440;
    structName_05._M_string_length._4_4_ = uStack_43c;
    structName_05.field_2._M_allocated_capacity = (size_type)local_438.allocator;
    structName_05.field_2._8_4_ = lpidx;
    structName_05.field_2._12_4_ = uStack_42c;
    TType::getCompleteString
              (&errmsg,pTVar16,true,(bool)getQualifiers,bVar2,true,name_05,structName_05);
    TInfoSinkBase::append(&infoSink->info,&errmsg);
  }
  else {
LAB_00300989:
    TInfoSinkBase::append(&infoSink->info,"    ");
    pcVar11 = StageName(language);
    TInfoSinkBase::append(&infoSink->info,pcVar11);
    if ((char)local_444 != '\0') {
      TInfoSinkBase::append(&infoSink->info," stage: \"");
      iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      uVar28 = (undefined4)((ulong)this >> 0x20);
      iVar21 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string(&local_210,
                   (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   CONCAT44(extraout_var_x00147,iVar21));
      local_438.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>(local_238,"",&local_438);
      bVar2 = (bool)(char)local_428;
      name_04._M_dataplus._M_p = (pointer)local_238;
      name_04._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_210;
      name_04._M_string_length._0_4_ = in_stack_fffffffffffffb98;
      name_04._M_string_length._4_4_ = EVar23;
      name_04.field_2._M_allocated_capacity._0_4_ = uVar27;
      name_04.field_2._M_allocated_capacity._4_4_ = uVar28;
      name_04.field_2._8_8_ = pTVar24;
      structName_04._M_dataplus._M_p._0_4_ = language;
      structName_04._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)infoSink;
      structName_04._M_dataplus._M_p._4_4_ = local_444;
      structName_04._M_string_length._0_4_ = local_440;
      structName_04._M_string_length._4_4_ = uStack_43c;
      structName_04.field_2._M_allocated_capacity = (size_type)local_438.allocator;
      structName_04.field_2._8_4_ = lpidx;
      structName_04.field_2._12_4_ = uStack_42c;
      TType::getCompleteString
                (&errmsg,(TType *)CONCAT44(extraout_var_x00146,iVar6),true,(bool)getQualifiers,
                 (bool)(char)local_428,true,name_04,structName_04);
      TInfoSinkBase::append(&infoSink->info,&errmsg);
      TInfoSinkBase::append(&infoSink->info,"\"\n");
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar11 = StageName(EVar23);
      TInfoSinkBase::append(&infoSink->info,pcVar11);
      TInfoSinkBase::append(&infoSink->info," stage: \"");
      pTVar31 = pTVar24;
      iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
      pTVar16 = (TType *)CONCAT44(extraout_var_x00148,iVar6);
      iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar24);
      pbVar17 = &local_260;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string(pbVar17,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_x00149,iVar6));
      local_438.allocator = GetThreadPoolAllocator();
      pbVar15 = &local_288;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)pbVar15,
                 "",&local_438);
      this = (TIntermediate *)CONCAT44(uVar28,uVar27);
      getQualifiers = (undefined1)uVar27;
      goto LAB_00300b0a;
    }
    TInfoSinkBase::append(&infoSink->info," stage: ");
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
    TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_x00150,iVar6));
    TInfoSinkBase::append(&infoSink->info," \"");
    iVar6 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    local_438.allocator = GetThreadPoolAllocator();
    uVar28 = (undefined4)((ulong)this >> 0x20);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>(local_2b0,"",&local_438);
    pTVar13 = GetThreadPoolAllocator();
    lpidx = (int)pTVar13;
    uStack_42c = (undefined4)((ulong)pTVar13 >> 0x20);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>(local_2d8,"",(pool_allocator<char> *)&lpidx);
    uVar27 = (uint)(byte)(char)local_428;
    name_06._M_dataplus._M_p = (pointer)local_2d8;
    name_06._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_2b0;
    name_06._M_string_length._0_4_ = in_stack_fffffffffffffb98;
    name_06._M_string_length._4_4_ = EVar23;
    name_06.field_2._M_local_buf[0] = (char)local_428;
    name_06.field_2._M_allocated_capacity._1_3_ = 0;
    name_06.field_2._M_allocated_capacity._4_4_ = uVar28;
    name_06.field_2._8_8_ = pTVar24;
    structName_06._M_dataplus._M_p._0_4_ = language;
    structName_06._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)infoSink;
    structName_06._M_dataplus._M_p._4_4_ = local_444;
    structName_06._M_string_length._0_4_ = local_440;
    structName_06._M_string_length._4_4_ = uStack_43c;
    structName_06.field_2._M_allocated_capacity = (size_type)local_438.allocator;
    structName_06.field_2._8_4_ = lpidx;
    structName_06.field_2._12_4_ = uStack_42c;
    TType::getCompleteString
              (&errmsg,(TType *)CONCAT44(extraout_var_x00151,iVar6),true,(bool)getQualifiers,
               (bool)(char)local_428,false,name_06,structName_06);
    TInfoSinkBase::append(&infoSink->info,&errmsg);
    TInfoSinkBase::append(&infoSink->info,"\"\n");
    TInfoSinkBase::append(&infoSink->info,"    ");
    pcVar11 = StageName(EVar23);
    TInfoSinkBase::append(&infoSink->info,pcVar11);
    TInfoSinkBase::append(&infoSink->info," stage: ");
    pTVar31 = pTVar24;
    iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar24);
    TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_x00152,iVar6));
    TInfoSinkBase::append(&infoSink->info," \"");
    iVar6 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
    pTVar16 = (TType *)CONCAT44(extraout_var_x00153,iVar6);
    local_438.allocator = GetThreadPoolAllocator();
    this_00 = local_300;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>(this_00,"",&local_438);
    pTVar13 = GetThreadPoolAllocator();
    lpidx = (int)pTVar13;
    uStack_42c = (undefined4)((ulong)pTVar13 >> 0x20);
    this_01 = local_328;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>(this_01,"",(pool_allocator<char> *)&lpidx);
    getPrecision = (undefined1)uVar27;
LAB_00300cd0:
    name_07._M_dataplus._M_p = (pointer)this_01;
    name_07._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)this_00;
    name_07._M_string_length._0_4_ = in_stack_fffffffffffffb98;
    name_07._M_string_length._4_4_ = EVar23;
    name_07.field_2._M_allocated_capacity._0_4_ = uVar27;
    name_07.field_2._M_allocated_capacity._4_4_ = uVar28;
    name_07.field_2._8_8_ = pTVar31;
    structName_07._M_dataplus._M_p._0_4_ = language;
    structName_07._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)infoSink;
    structName_07._M_dataplus._M_p._4_4_ = local_444;
    structName_07._M_string_length._0_4_ = local_440;
    structName_07._M_string_length._4_4_ = uStack_43c;
    structName_07.field_2._M_allocated_capacity = (size_type)local_438.allocator;
    structName_07.field_2._8_4_ = lpidx;
    structName_07.field_2._12_4_ = uStack_42c;
    TType::getCompleteString
              (&errmsg,pTVar16,true,(bool)getQualifiers,(bool)getPrecision,false,name_07,
               structName_07);
    TInfoSinkBase::append(&infoSink->info,&errmsg);
  }
  pcVar11 = "\"\n";
LAB_00300cf5:
  TInfoSinkBase::append(&infoSink->info,pcVar11);
  return;
}

Assistant:

void TIntermediate::mergeErrorCheck(TInfoSink& infoSink, const TIntermSymbol& symbol, const TIntermSymbol& unitSymbol)
{
    EShLanguage stage = symbol.getStage();
    EShLanguage unitStage = unitSymbol.getStage();
    bool crossStage = stage != unitStage;
    bool writeTypeComparison = false;
    bool errorReported = false;
    bool printQualifiers = false;
    bool printPrecision = false;
    bool printType = false;

    // Types have to match
    {
        // but, we make an exception if one is an implicit array and the other is sized
        // or if the array sizes differ because of the extra array dimension on some in/out boundaries
        bool arraysMatch = false;
        if (isIoResizeArray(symbol.getType(), stage) || isIoResizeArray(unitSymbol.getType(), unitStage)) {
            // if the arrays have an extra dimension because of the stage.
            // compare dimensions while ignoring the outer dimension
            unsigned int firstDim = isIoResizeArray(symbol.getType(), stage) ? 1 : 0;
            unsigned int numDim = symbol.getArraySizes()
                ? symbol.getArraySizes()->getNumDims() : 0;
            unsigned int unitFirstDim = isIoResizeArray(unitSymbol.getType(), unitStage) ? 1 : 0;
            unsigned int unitNumDim = unitSymbol.getArraySizes()
                ? unitSymbol.getArraySizes()->getNumDims() : 0;
            arraysMatch = (numDim - firstDim) == (unitNumDim - unitFirstDim);
            // check that array sizes match as well
            for (unsigned int i = 0; i < (numDim - firstDim) && arraysMatch; i++) {
                if (symbol.getArraySizes()->getDimSize(firstDim + i) !=
                    unitSymbol.getArraySizes()->getDimSize(unitFirstDim + i)) {
                    arraysMatch = false;
                    break;
                }
            }
        }
        else {
            arraysMatch = symbol.getType().sameArrayness(unitSymbol.getType()) ||
                (symbol.getType().isArray() && unitSymbol.getType().isArray() &&
                 (symbol.getType().isImplicitlySizedArray() || unitSymbol.getType().isImplicitlySizedArray() ||
                  symbol.getType().isUnsizedArray() || unitSymbol.getType().isUnsizedArray()));
        }

        int lpidx = -1;
        int rpidx = -1;
        if (!symbol.getType().sameElementType(unitSymbol.getType(), &lpidx, &rpidx)) {
            if (lpidx >= 0 && rpidx >= 0) {
                error(infoSink, "Member names and types must match:", unitStage);
                infoSink.info << "    Block: " << symbol.getType().getTypeName() << "\n";
                infoSink.info << "        " << StageName(stage) << " stage: \""
                              << (*symbol.getType().getStruct())[lpidx].type->getCompleteString(true, false, false, true,
                                      (*symbol.getType().getStruct())[lpidx].type->getFieldName()) << "\"\n";
                infoSink.info << "        " << StageName(unitStage) << " stage: \""
                              << (*unitSymbol.getType().getStruct())[rpidx].type->getCompleteString(true, false, false, true,
                                      (*unitSymbol.getType().getStruct())[rpidx].type->getFieldName()) << "\"\n";
                errorReported = true;
            } else if (lpidx >= 0 && rpidx == -1) {
                  TString errmsg = StageName(stage);
                  errmsg.append(" block member has no corresponding member in ").append(StageName(unitStage)).append(" block:");
                  error(infoSink, errmsg.c_str(), unitStage);
                  infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << ", Member: "
                    << (*symbol.getType().getStruct())[lpidx].type->getFieldName() << "\n";
                  infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << ", Member: n/a \n";
                  errorReported = true;
            } else if (lpidx == -1 && rpidx >= 0) {
                  TString errmsg = StageName(unitStage);
                  errmsg.append(" block member has no corresponding member in ").append(StageName(stage)).append(" block:");
                  error(infoSink, errmsg.c_str(), unitStage);
                  infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << ", Member: "
                    << (*unitSymbol.getType().getStruct())[rpidx].type->getFieldName() << "\n";
                  infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << ", Member: n/a \n";
                  errorReported = true;
            } else {
                  error(infoSink, "Types must match:", unitStage);
                  writeTypeComparison = true;
                  printType = true;
            }
        } else if (!arraysMatch) {
            error(infoSink, "Array sizes must be compatible:", unitStage);
            writeTypeComparison = true;
            printType = true;
        } else if (!symbol.getType().sameTypeParameters(unitSymbol.getType())) {
            error(infoSink, "Type parameters must match:", unitStage);
            writeTypeComparison = true;
            printType = true;
        }
    }

    // Interface block  member-wise layout qualifiers have to match
    if (symbol.getType().getBasicType() == EbtBlock && unitSymbol.getType().getBasicType() == EbtBlock &&
        symbol.getType().getStruct() && unitSymbol.getType().getStruct() &&
        symbol.getType().sameStructType(unitSymbol.getType())) {
        unsigned int li = 0;
        unsigned int ri = 0;
        while (li < symbol.getType().getStruct()->size() && ri < unitSymbol.getType().getStruct()->size()) {
            if ((*symbol.getType().getStruct())[li].type->hiddenMember()) {
                ++li;
                continue;
            }
            if ((*unitSymbol.getType().getStruct())[ri].type->hiddenMember()) {
                ++ri;
                continue;
            }
            const TQualifier& qualifier = (*symbol.getType().getStruct())[li].type->getQualifier();
            const TQualifier & unitQualifier = (*unitSymbol.getType().getStruct())[ri].type->getQualifier();
            bool layoutQualifierError = false;
            if (qualifier.layoutMatrix != unitQualifier.layoutMatrix) {
                error(infoSink, "Interface block member layout matrix qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutOffset != unitQualifier.layoutOffset) {
                error(infoSink, "Interface block member layout offset qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutAlign != unitQualifier.layoutAlign) {
                error(infoSink, "Interface block member layout align qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutLocation != unitQualifier.layoutLocation) {
                error(infoSink, "Interface block member layout location qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutComponent != unitQualifier.layoutComponent) {
                error(infoSink, "Interface block member layout component qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (layoutQualifierError) {
                infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << ", Member: "
                              << (*symbol.getType().getStruct())[li].type->getFieldName() << " \""
                              << (*symbol.getType().getStruct())[li].type->getCompleteString(true, true, false, false) << "\"\n";
                infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << ", Member: "
                              << (*unitSymbol.getType().getStruct())[ri].type->getFieldName() << " \""
                              << (*unitSymbol.getType().getStruct())[ri].type->getCompleteString(true, true, false, false) << "\"\n";
                errorReported = true;
            }
            ++li;
            ++ri;
        }
    }

    bool isInOut = crossStage &&
                   ((symbol.getQualifier().storage == EvqVaryingIn && unitSymbol.getQualifier().storage == EvqVaryingOut) ||
                   (symbol.getQualifier().storage == EvqVaryingOut && unitSymbol.getQualifier().storage == EvqVaryingIn));

    // Qualifiers have to (almost) match
    // Storage...
    if (!isInOut && symbol.getQualifier().storage != unitSymbol.getQualifier().storage) {
        error(infoSink, "Storage qualifiers must match:", unitStage);
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Uniform and buffer blocks must either both have an instance name, or
    // must both be anonymous. The names don't need to match though.
    if (symbol.getQualifier().isUniformOrBuffer() &&
        (IsAnonymous(symbol.getName()) != IsAnonymous(unitSymbol.getName()))) {
        error(infoSink, "Matched Uniform or Storage blocks must all be anonymous,"
                        " or all be named:", unitStage);
        writeTypeComparison = true;
    }

    if (symbol.getQualifier().storage == unitSymbol.getQualifier().storage &&
        (IsAnonymous(symbol.getName()) != IsAnonymous(unitSymbol.getName()) ||
         (!IsAnonymous(symbol.getName()) && symbol.getName() != unitSymbol.getName()))) {
        warn(infoSink, "Matched shader interfaces are using different instance names.", unitStage);
        writeTypeComparison = true;
    }

    // Precision...
    if (!isInOut && symbol.getQualifier().precision != unitSymbol.getQualifier().precision) {
        error(infoSink, "Precision qualifiers must match:", unitStage);
        writeTypeComparison = true;
        printPrecision = true;
    }

    // Invariance...
    if (! crossStage && symbol.getQualifier().invariant != unitSymbol.getQualifier().invariant) {
        error(infoSink, "Presence of invariant qualifier must match:", unitStage);
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Precise...
    if (! crossStage && symbol.getQualifier().isNoContraction() != unitSymbol.getQualifier().isNoContraction()) {
        error(infoSink, "Presence of precise qualifier must match:", unitStage);
        writeTypeComparison = true;
        printPrecision = true;
    }

    // Auxiliary and interpolation...
    // "interpolation qualification (e.g., flat) and auxiliary qualification (e.g. centroid) may differ.
    //  These mismatches are allowed between any pair of stages ...
    //  those provided in the fragment shader supersede those provided in previous stages."
    if (!crossStage &&
        (symbol.getQualifier().centroid  != unitSymbol.getQualifier().centroid ||
        symbol.getQualifier().smooth    != unitSymbol.getQualifier().smooth ||
        symbol.getQualifier().flat      != unitSymbol.getQualifier().flat ||
        symbol.getQualifier().isSample()!= unitSymbol.getQualifier().isSample() ||
        symbol.getQualifier().isPatch() != unitSymbol.getQualifier().isPatch() ||
        symbol.getQualifier().isNonPerspective() != unitSymbol.getQualifier().isNonPerspective())) {
        error(infoSink, "Interpolation and auxiliary storage qualifiers must match:", unitStage);
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Memory...
    bool memoryQualifierError = false;
    if (symbol.getQualifier().coherent != unitSymbol.getQualifier().coherent) {
        error(infoSink, "Memory coherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().devicecoherent != unitSymbol.getQualifier().devicecoherent) {
        error(infoSink, "Memory devicecoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().queuefamilycoherent != unitSymbol.getQualifier().queuefamilycoherent) {
        error(infoSink, "Memory queuefamilycoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().workgroupcoherent != unitSymbol.getQualifier().workgroupcoherent) {
        error(infoSink, "Memory workgroupcoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().subgroupcoherent != unitSymbol.getQualifier().subgroupcoherent) {
        error(infoSink, "Memory subgroupcoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().shadercallcoherent != unitSymbol.getQualifier().shadercallcoherent) {
        error(infoSink, "Memory shadercallcoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().nonprivate != unitSymbol.getQualifier().nonprivate) {
        error(infoSink, "Memory nonprivate qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().volatil != unitSymbol.getQualifier().volatil) {
        error(infoSink, "Memory volatil qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().nontemporal != unitSymbol.getQualifier().nontemporal) {
        error(infoSink, "Memory nontemporal qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().restrict != unitSymbol.getQualifier().restrict) {
        error(infoSink, "Memory restrict qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().readonly != unitSymbol.getQualifier().readonly) {
        error(infoSink, "Memory readonly qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().writeonly != unitSymbol.getQualifier().writeonly) {
        error(infoSink, "Memory writeonly qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (memoryQualifierError) {
          writeTypeComparison = true;
          printQualifiers = true;
    }

    // Layouts...
    // TODO: 4.4 enhanced layouts: Generalize to include offset/align: current spec
    //       requires separate user-supplied offset from actual computed offset, but
    //       current implementation only has one offset.
    bool layoutQualifierError = false;
    if (symbol.getQualifier().layoutMatrix != unitSymbol.getQualifier().layoutMatrix) {
        error(infoSink, "Layout matrix qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().layoutPacking != unitSymbol.getQualifier().layoutPacking) {
        error(infoSink, "Layout packing qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().hasLocation() && unitSymbol.getQualifier().hasLocation() && symbol.getQualifier().layoutLocation != unitSymbol.getQualifier().layoutLocation) {
        error(infoSink, "Layout location qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().layoutComponent != unitSymbol.getQualifier().layoutComponent) {
        error(infoSink, "Layout component qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().layoutIndex != unitSymbol.getQualifier().layoutIndex) {
        error(infoSink, "Layout index qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().hasBinding() && unitSymbol.getQualifier().hasBinding() && symbol.getQualifier().layoutBinding != unitSymbol.getQualifier().layoutBinding) {
        error(infoSink, "Layout binding qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().hasBinding() && (symbol.getQualifier().layoutOffset != unitSymbol.getQualifier().layoutOffset)) {
        error(infoSink, "Layout offset qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (layoutQualifierError) {
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Initializers have to match, if both are present, and if we don't already know the types don't match
    if (! writeTypeComparison && ! errorReported) {
        if (! symbol.getConstArray().empty() && ! unitSymbol.getConstArray().empty()) {
            if (symbol.getConstArray() != unitSymbol.getConstArray()) {
                error(infoSink, "Initializers must match:", unitStage);
                infoSink.info << "    " << symbol.getName() << "\n";
            }
        }
    }

    if (writeTypeComparison) {
        if (symbol.getType().getBasicType() == EbtBlock && unitSymbol.getType().getBasicType() == EbtBlock &&
            symbol.getType().getStruct() && unitSymbol.getType().getStruct()) {
          if (printType) {
            infoSink.info << "    " << StageName(stage) << " stage: \"" << symbol.getType().getCompleteString(true, printQualifiers, printPrecision,
                                                    printType, symbol.getName(), symbol.getType().getTypeName()) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: \"" << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision,
                                                    printType, unitSymbol.getName(), unitSymbol.getType().getTypeName()) << "\"\n";
          } else {
            infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << " Instance: " << symbol.getName()
              << ": \"" << symbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << " Instance: " << unitSymbol.getName()
              << ": \"" << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
          }
        } else {
          if (printType) {
            infoSink.info << "    " << StageName(stage) << " stage: \""
              << symbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType, symbol.getName()) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: \""
              << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType, unitSymbol.getName()) << "\"\n";
          } else {
            infoSink.info << "    " << StageName(stage) << " stage: " << symbol.getName() << " \""
              << symbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: " << unitSymbol.getName() << " \""
              << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
          }
        }
    }
}